

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O1

int Llb_Nonlin4Reachability(Llb_Mnx_t *p)

{
  Gia_ParLlb_t *pGVar1;
  DdManager *pDVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  void **ppvVar8;
  Vec_Ptr_t *pVVar9;
  Abc_Cex_t *pAVar10;
  abctime aVar11;
  int fVerbose;
  long lVar12;
  long lVar13;
  abctime time;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  char *pcVar17;
  Aig_Man_t *pAVar18;
  long lVar19;
  double dVar20;
  timespec ts;
  timespec local_60;
  double local_50;
  uint local_48;
  uint local_44;
  double local_40;
  long local_38;
  
  iVar3 = clock_gettime(3,&local_60);
  if (iVar3 < 0) {
    lVar19 = -1;
  }
  else {
    lVar19 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  pAVar18 = p->pAig;
  if (pAVar18->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb4Nonlin.c"
                  ,0x2a3,"int Llb_Nonlin4Reachability(Llb_Mnx_t *)");
  }
  pGVar1 = p->pPars;
  if (pGVar1->fBackward == 0) {
    if (pGVar1->fSkipOutCheck == 0) {
      pDVar2 = p->dd;
      if (pGVar1->fCluster == 0) {
        pDVar6 = Llb_Nonlin4ComputeBad(pDVar2,pAVar18,p->vOrder);
        p->bBad = pDVar6;
        if (pDVar6 == (DdNode *)0x0) goto LAB_0083cff1;
        Cudd_Ref(pDVar6);
      }
      else {
        p->bBad = pDVar2->bFunc;
        pDVar2->bFunc = (DdNode *)0x0;
      }
    }
    else {
      pDVar6 = p->dd->bFunc;
      if (pDVar6 != (DdNode *)0x0) {
        Cudd_RecursiveDeref(p->dd,pDVar6);
        p->dd->bFunc = (DdNode *)0x0;
      }
    }
    pDVar6 = Llb_Nonlin4ComputeInitState(p->dd,p->pAig,p->vOrder,p->pPars->fBackward);
    p->bCurrent = pDVar6;
    Cudd_Ref(pDVar6);
LAB_0083c975:
    p->bReached = p->bCurrent;
    local_38 = lVar19;
    Cudd_Ref(p->bCurrent);
    if (p->pPars->nIterMax < 1) {
      uVar14 = 0;
    }
    else {
      uVar14 = 0;
      local_48 = 0;
      local_44 = 0;
      local_40 = (double)((ulong)local_40 & 0xffffffff00000000);
      do {
        iVar3 = clock_gettime(3,&local_60);
        if (iVar3 < 0) {
          lVar19 = 1;
        }
        else {
          lVar19 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
          lVar19 = ((lVar19 >> 7) - (lVar19 >> 0x3f)) + local_60.tv_sec * -1000000;
        }
        if (p->pPars->TimeLimit != 0) {
          iVar3 = clock_gettime(3,&local_60);
          if (iVar3 < 0) {
            lVar12 = -1;
          }
          else {
            lVar12 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
          }
          pGVar1 = p->pPars;
          if (lVar12 <= pGVar1->TimeTarget) goto LAB_0083ca54;
          if (pGVar1->fSilent == 0) {
            uVar15 = (ulong)(uint)pGVar1->TimeLimit;
            pcVar17 = "Reached timeout (%d seconds) during image computation.\n";
            goto LAB_0083d0d0;
          }
LAB_0083d0d7:
          uVar14 = uVar14 - 1;
LAB_0083d0d9:
          p->pPars->iFrame = uVar14;
          return -1;
        }
LAB_0083ca54:
        local_50 = (double)CONCAT44(local_50._4_4_,uVar14);
        pDVar6 = p->bCurrent;
        pVVar9 = p->vRings;
        uVar14 = pVVar9->nCap;
        if (pVVar9->nSize == uVar14) {
          if ((int)uVar14 < 0x10) {
            if (pVVar9->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc(0x80);
            }
            else {
              ppvVar8 = (void **)realloc(pVVar9->pArray,0x80);
            }
            pVVar9->pArray = ppvVar8;
            iVar3 = 0x10;
          }
          else {
            iVar3 = uVar14 * 2;
            if (iVar3 <= (int)uVar14) goto LAB_0083cad5;
            if (pVVar9->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc((ulong)uVar14 << 4);
            }
            else {
              ppvVar8 = (void **)realloc(pVVar9->pArray,(ulong)uVar14 << 4);
            }
            pVVar9->pArray = ppvVar8;
          }
          pVVar9->nCap = iVar3;
        }
LAB_0083cad5:
        iVar3 = pVVar9->nSize;
        pVVar9->nSize = iVar3 + 1;
        pVVar9->pArray[iVar3] = pDVar6;
        Cudd_Ref(p->bCurrent);
        if ((p->pPars->fSkipOutCheck == 0) &&
           (iVar3 = Cudd_bddLeq(p->dd,p->bCurrent,(DdNode *)((ulong)p->bBad ^ 1)), iVar3 == 0)) {
          if (p->pAig->pSeqModel != (Abc_Cex_t *)0x0) {
            __assert_fail("p->pAig->pSeqModel == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb4Nonlin.c"
                          ,0x2f6,"int Llb_Nonlin4Reachability(Llb_Mnx_t *)");
          }
          pVVar9 = Llb_Nonlin4DeriveCex(p,p->pPars->fBackward,fVerbose);
          pAVar18 = p->pAig;
          pAVar10 = Llb4_Nonlin4TransformCex(pAVar18,pVVar9,-1,p->pPars->fVerbose);
          dVar20 = local_50;
          iVar16 = (int)pAVar18;
          p->pAig->pSeqModel = pAVar10;
          iVar3 = local_50._0_4_;
          if (pVVar9 != (Vec_Ptr_t *)0x0) {
            if (pVVar9->pArray != (void **)0x0) {
              free(pVVar9->pArray);
              pVVar9->pArray = (void **)0x0;
            }
            free(pVVar9);
            iVar16 = (int)pVVar9;
          }
          if (p->pPars->fSilent == 0) {
            Abc_Print(iVar16,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                      (ulong)(uint)p->pAig->pSeqModel->iPo,p->pAig->pName,(ulong)dVar20 & 0xffffffff
                     );
            aVar11 = Abc_Clock();
            Abc_PrintTime(0xa00e9c,(char *)(aVar11 - local_38),time);
          }
          p->pPars->iFrame = iVar3 + -1;
          return 0;
        }
        iVar3 = clock_gettime(3,&local_60);
        dVar20 = local_50;
        if (iVar3 < 0) {
          lVar12 = 1;
        }
        else {
          lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
          lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_60.tv_sec * -1000000;
        }
        uVar14 = local_50._0_4_;
        pDVar6 = Llb_Nonlin4Image(p->dd,p->vRoots,p->bCurrent,p->vVars2Q);
        p->bNext = pDVar6;
        if (pDVar6 == (DdNode *)0x0) {
          if (p->pPars->fSilent == 0) {
            uVar15 = (ulong)(uint)p->pPars->TimeLimit;
            pcVar17 = "Reached timeout (%d seconds) during image computation in quantification.\n";
LAB_0083d0d0:
            printf(pcVar17,uVar15);
          }
          goto LAB_0083d0d7;
        }
        Cudd_Ref(pDVar6);
        iVar3 = clock_gettime(3,&local_60);
        if (iVar3 < 0) {
          lVar13 = -1;
        }
        else {
          lVar13 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
        }
        p->timeImage = p->timeImage + lVar13 + lVar12;
        iVar3 = clock_gettime(3,&local_60);
        if (iVar3 < 0) {
          lVar12 = 1;
        }
        else {
          lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
          lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_60.tv_sec * -1000000;
        }
        pDVar6 = p->bNext;
        pDVar7 = Cudd_bddVarMap(p->dd,pDVar6);
        p->bNext = pDVar7;
        if (pDVar7 == (DdNode *)0x0) {
          if (p->pPars->fSilent == 0) {
            printf("Reached timeout (%d seconds) during remapping next states.\n",
                   (ulong)(uint)p->pPars->TimeLimit);
          }
          Cudd_RecursiveDeref(p->dd,pDVar6);
          goto LAB_0083d0d7;
        }
        Cudd_Ref(pDVar7);
        Cudd_RecursiveDeref(p->dd,pDVar6);
        iVar3 = clock_gettime(3,&local_60);
        if (iVar3 < 0) {
          lVar13 = -1;
        }
        else {
          lVar13 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
        }
        p->timeRemap = p->timeRemap + lVar13 + lVar12;
        if (p->pPars->fVerbose != 0) {
          iVar3 = Cudd_DagSize(p->bCurrent);
          local_40 = (double)CONCAT44(local_40._4_4_,iVar3);
          local_44 = Cudd_DagSize(pDVar6);
          local_48 = Cudd_DagSize(p->bNext);
        }
        Cudd_RecursiveDeref(p->dd,p->bCurrent);
        p->bCurrent = (DdNode *)0x0;
        pDVar6 = Cudd_bddAnd(p->dd,p->bNext,(DdNode *)((ulong)p->bReached ^ 1));
        p->bCurrent = pDVar6;
        if (pDVar6 == (DdNode *)0x0) {
          if (p->pPars->fSilent == 0) {
            uVar15 = (ulong)(uint)p->pPars->TimeLimit;
            pcVar17 = "Reached timeout (%d seconds) during image computation in transfer 1.\n";
            goto LAB_0083d0d0;
          }
          goto LAB_0083d0d7;
        }
        Cudd_Ref(pDVar6);
        Cudd_RecursiveDeref(p->dd,p->bNext);
        p->bNext = (DdNode *)0x0;
        if (*(int *)((ulong)p->bCurrent & 0xfffffffffffffffe) == 0x7fffffff) break;
        pDVar6 = p->bReached;
        pDVar7 = Cudd_bddOr(p->dd,pDVar6,p->bCurrent);
        p->bReached = pDVar7;
        if (pDVar7 == (DdNode *)0x0) {
          if (p->pPars->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation in transfer 1.\n",
                   (ulong)(uint)p->pPars->TimeLimit);
          }
          p->pPars->iFrame = uVar14 - 1;
          Cudd_RecursiveDeref(p->dd,pDVar6);
          return -1;
        }
        Cudd_Ref(pDVar7);
        Cudd_RecursiveDeref(p->dd,pDVar6);
        if (p->pPars->fVerbose != 0) {
          printf("I =%5d : ",(ulong)dVar20 & 0xffffffff);
          printf("Fr =%7d  ",(ulong)local_40 & 0xffffffff);
          printf("ImNs =%7d  ",(ulong)local_44);
          printf("ImCs =%7d  ",(ulong)local_48);
          uVar4 = Cudd_DagSize(p->bReached);
          printf("Rea =%7d   ",(ulong)uVar4);
          uVar4 = Cudd_ReadReorderings(p->dd);
          uVar5 = Cudd_ReadGarbageCollections(p->dd);
          printf("(%4d %4d)  ",(ulong)uVar4,(ulong)uVar5);
          iVar16 = 3;
          iVar3 = clock_gettime(3,&local_60);
          if (iVar3 < 0) {
            lVar12 = -1;
          }
          else {
            lVar12 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
          }
          Abc_Print(iVar16,"%s =","T");
          Abc_Print(iVar16,"%9.2f sec\n",(double)(lVar12 + lVar19) / 1000000.0);
        }
        if (uVar14 == p->pPars->nIterMax - 1U) {
          if (p->pPars->fSilent == 0) {
            printf("Reached limit on the number of timeframes (%d).\n");
          }
          goto LAB_0083d0d9;
        }
        uVar14 = uVar14 + 1;
      } while ((int)uVar14 < p->pPars->nIterMax);
    }
    if (p->pPars->fVerbose != 0) {
      local_50 = Cudd_CountMinterm(p->dd,p->bReached,p->pAig->nRegs);
      if ((p->bCurrent == (DdNode *)0x0) ||
         (*(int *)((ulong)p->bCurrent & 0xfffffffffffffffe) != 0x7fffffff)) {
        pcVar17 = "Reachability analysis is stopped after %d frames.\n";
      }
      else {
        pcVar17 = "Reachability analysis completed after %d frames.\n";
      }
      printf(pcVar17,(ulong)uVar14);
      local_40 = local_50 * 100.0;
      dVar20 = ldexp(1.0,p->pAig->nRegs);
      printf("Reachable states = %.0f. (Ratio = %.4f %%)\n",local_50,local_40 / dVar20);
      fflush(_stdout);
    }
    if ((p->bCurrent != (DdNode *)0x0) &&
       (*(int *)((ulong)p->bCurrent & 0xfffffffffffffffe) == 0x7fffffff)) {
      if (p->pPars->fSilent == 0) {
        printf("The miter is proved unreachable after %d iterations.  ",(ulong)uVar14);
      }
      if (p->pPars->fSilent == 0) {
        iVar16 = 3;
        iVar3 = clock_gettime(3,&local_60);
        if (iVar3 < 0) {
          lVar19 = -1;
        }
        else {
          lVar19 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
        }
        lVar19 = lVar19 - local_38;
        Abc_Print(iVar16,"%s =","Time");
        Abc_Print(iVar16,"%9.2f sec\n",(double)lVar19 / 1000000.0);
      }
      p->pPars->iFrame = uVar14 - 1;
      return 1;
    }
    if (p->pPars->fSilent == 0) {
      printf("Verified only for states reachable in %d frames.  ",(ulong)uVar14);
    }
    p->pPars->iFrame = p->pPars->nIterMax;
  }
  else {
    if (pGVar1->fSkipOutCheck == 0) {
      pDVar6 = Llb_Nonlin4ComputeInitState(p->dd,pAVar18,p->vOrder,pGVar1->fBackward);
      p->bBad = pDVar6;
      Cudd_Ref(pDVar6);
    }
    pDVar2 = p->dd;
    if (p->pPars->fCluster == 0) {
      pDVar6 = Llb_Nonlin4ComputeBad(pDVar2,p->pAig,p->vOrder);
      p->bCurrent = pDVar6;
      if (pDVar6 != (DdNode *)0x0) {
        Cudd_Ref(pDVar6);
        goto LAB_0083c8b4;
      }
LAB_0083cff1:
      if (p->pPars->fSilent == 0) {
        printf("Reached timeout (%d seconds) during constructing the bad states.\n",
               (ulong)(uint)p->pPars->TimeLimit);
      }
    }
    else {
      p->bCurrent = pDVar2->bFunc;
      pDVar2->bFunc = (DdNode *)0x0;
LAB_0083c8b4:
      pDVar6 = p->bCurrent;
      pDVar7 = Cudd_bddVarMap(p->dd,pDVar6);
      p->bCurrent = pDVar7;
      if (pDVar7 != (DdNode *)0x0) {
        Cudd_Ref(pDVar7);
        Cudd_RecursiveDeref(p->dd,pDVar6);
        goto LAB_0083c975;
      }
      if (p->pPars->fSilent == 0) {
        printf("Reached timeout (%d seconds) during remapping bad states.\n",
               (ulong)(uint)p->pPars->TimeLimit);
      }
      Cudd_RecursiveDeref(p->dd,pDVar6);
    }
    p->pPars->iFrame = -1;
  }
  return -1;
}

Assistant:

int Llb_Nonlin4Reachability( Llb_Mnx_t * p )
{ 
    DdNode * bAux;
    int nIters, nBddSizeFr = 0, nBddSizeTo = 0, nBddSizeTo2 = 0;
    abctime clkTemp, clkIter, clk = Abc_Clock();
    assert( Aig_ManRegNum(p->pAig) > 0 );

    if ( p->pPars->fBackward )
    {
        // create bad state in the ring manager
        if ( !p->pPars->fSkipOutCheck )
        {
            p->bBad = Llb_Nonlin4ComputeInitState( p->dd, p->pAig, p->vOrder, p->pPars->fBackward );  Cudd_Ref( p->bBad );
        }
        // create init state
        if ( p->pPars->fCluster )
            p->bCurrent = p->dd->bFunc, p->dd->bFunc = NULL; 
        else
        {
            p->bCurrent = Llb_Nonlin4ComputeBad( p->dd, p->pAig, p->vOrder );          
            if ( p->bCurrent == NULL )
            {
                if ( !p->pPars->fSilent )
                    printf( "Reached timeout (%d seconds) during constructing the bad states.\n", p->pPars->TimeLimit );
                p->pPars->iFrame = -1;
                return -1;
            }
            Cudd_Ref( p->bCurrent );
        }
        // remap into the next states
        p->bCurrent = Cudd_bddVarMap( p->dd, bAux = p->bCurrent );
        if ( p->bCurrent == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during remapping bad states.\n",  p->pPars->TimeLimit );
            Cudd_RecursiveDeref( p->dd, bAux );
            p->pPars->iFrame = -1;
            return -1;
        }
        Cudd_Ref( p->bCurrent );
        Cudd_RecursiveDeref( p->dd, bAux );
    }
    else
    {
        // create bad state in the ring manager
        if ( !p->pPars->fSkipOutCheck )
        {
            if ( p->pPars->fCluster )
                p->bBad = p->dd->bFunc, p->dd->bFunc = NULL; 
            else
            {
                p->bBad = Llb_Nonlin4ComputeBad( p->dd, p->pAig, p->vOrder );          
                if ( p->bBad == NULL )
                {
                    if ( !p->pPars->fSilent )
                        printf( "Reached timeout (%d seconds) during constructing the bad states.\n", p->pPars->TimeLimit );
                    p->pPars->iFrame = -1;
                    return -1;
                }
                Cudd_Ref( p->bBad );
            }
        }
        else if ( p->dd->bFunc )
            Cudd_RecursiveDeref( p->dd, p->dd->bFunc ), p->dd->bFunc = NULL;
        // compute the starting set of states
        p->bCurrent = Llb_Nonlin4ComputeInitState( p->dd, p->pAig, p->vOrder, p->pPars->fBackward );  Cudd_Ref( p->bCurrent );
    }
    // perform iterations
    p->bReached = p->bCurrent; Cudd_Ref( p->bReached );
    for ( nIters = 0; nIters < p->pPars->nIterMax; nIters++ )
    { 
        clkIter = Abc_Clock();
        // check the runtime limit
        if ( p->pPars->TimeLimit && Abc_Clock() > p->pPars->TimeTarget )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            return -1;
        }

        // save the onion ring
        Vec_PtrPush( p->vRings, p->bCurrent );   Cudd_Ref( p->bCurrent );

        // check it for bad states
        if ( !p->pPars->fSkipOutCheck && !Cudd_bddLeq( p->dd, p->bCurrent, Cudd_Not(p->bBad) ) ) 
        {
            Vec_Ptr_t * vStates;
            assert( p->pAig->pSeqModel == NULL );
            vStates = Llb_Nonlin4DeriveCex( p, p->pPars->fBackward, p->pPars->fVerbose ); 
            p->pAig->pSeqModel = Llb4_Nonlin4TransformCex( p->pAig, vStates, -1, p->pPars->fVerbose );
            Vec_PtrFreeP( &vStates );
            if ( !p->pPars->fSilent )
            {
                Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", p->pAig->pSeqModel->iPo, p->pAig->pName, nIters );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            p->pPars->iFrame = nIters - 1;
            return 0;
        }

        // compute the next states
        clkTemp = Abc_Clock();
        p->bNext = Llb_Nonlin4Image( p->dd, p->vRoots, p->bCurrent, p->vVars2Q );
        if ( p->bNext == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in quantification.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            return -1;
        }
        Cudd_Ref( p->bNext );
        p->timeImage += Abc_Clock() - clkTemp;

        // remap into current states
        clkTemp = Abc_Clock();
        p->bNext = Cudd_bddVarMap( p->dd, bAux = p->bNext );
        if ( p->bNext == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during remapping next states.\n",  p->pPars->TimeLimit );
            Cudd_RecursiveDeref( p->dd, bAux );
            p->pPars->iFrame = nIters - 1;
            return -1;
        }
        Cudd_Ref( p->bNext );
        Cudd_RecursiveDeref( p->dd, bAux );
        p->timeRemap += Abc_Clock() - clkTemp;

        // collect statistics
        if ( p->pPars->fVerbose )
        {
            nBddSizeFr  = Cudd_DagSize( p->bCurrent );
            nBddSizeTo  = Cudd_DagSize( bAux );
            nBddSizeTo2 = Cudd_DagSize( p->bNext );
        }
        Cudd_RecursiveDeref( p->dd, p->bCurrent ); p->bCurrent = NULL;

        // derive new states
        p->bCurrent = Cudd_bddAnd( p->dd, p->bNext, Cudd_Not(p->bReached) );     
        if ( p->bCurrent == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            return -1;
        }
        Cudd_Ref( p->bCurrent );
        Cudd_RecursiveDeref( p->dd, p->bNext ); p->bNext = NULL;
        if ( Cudd_IsConstant(p->bCurrent) )
            break;
/*
        // reduce BDD size using constrain // Cudd_bddRestrict
        p->bCurrent = Cudd_bddRestrict( p->dd, bAux = p->bCurrent, Cudd_Not(p->bReached) );   
        Cudd_Ref( p->bCurrent );
printf( "Before = %d.  After = %d.\n", Cudd_DagSize(bAux), Cudd_DagSize(p->bCurrent) );
        Cudd_RecursiveDeref( p->dd, bAux );
*/

        // add to the reached set
        p->bReached = Cudd_bddOr( p->dd, bAux = p->bReached, p->bCurrent );                 
        if ( p->bReached == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd, bAux );  
            return -1;
        }
        Cudd_Ref( p->bReached );
        Cudd_RecursiveDeref( p->dd, bAux );  


        // report the results
        if ( p->pPars->fVerbose )
        {
            printf( "I =%5d : ",   nIters );
            printf( "Fr =%7d  ",   nBddSizeFr );
            printf( "ImNs =%7d  ", nBddSizeTo );
            printf( "ImCs =%7d  ", nBddSizeTo2 );
            printf( "Rea =%7d   ", Cudd_DagSize(p->bReached) );
            printf( "(%4d %4d)  ", Cudd_ReadReorderings(p->dd), Cudd_ReadGarbageCollections(p->dd) );
            Abc_PrintTime( 1, "T", Abc_Clock() - clkIter );
        }
/*
        if ( pPars->fVerbose )
        {
            double nMints = Cudd_CountMinterm(p->dd, bReached, Saig_ManRegNum(p->pAig) );
//            Extra_bddPrint( p->dd, bReached );printf( "\n" );
            printf( "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p->pAig)) );
            fflush( stdout ); 
        }
*/
        if ( nIters == p->pPars->nIterMax - 1 )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached limit on the number of timeframes (%d).\n",  p->pPars->nIterMax );
            p->pPars->iFrame = nIters;
            return -1;
        }
    }
    
    // report the stats
    if ( p->pPars->fVerbose )
    {
        double nMints = Cudd_CountMinterm(p->dd, p->bReached, Saig_ManRegNum(p->pAig) );
        if ( p->bCurrent && Cudd_IsConstant(p->bCurrent) )
            printf( "Reachability analysis completed after %d frames.\n", nIters );
        else
            printf( "Reachability analysis is stopped after %d frames.\n", nIters );
        printf( "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p->pAig)) );
        fflush( stdout ); 
    }
    if ( p->bCurrent == NULL || !Cudd_IsConstant(p->bCurrent) )
    {
        if ( !p->pPars->fSilent )
            printf( "Verified only for states reachable in %d frames.  ", nIters );
        p->pPars->iFrame = p->pPars->nIterMax;
        return -1; // undecided
    }
    // report
    if ( !p->pPars->fSilent )
        printf( "The miter is proved unreachable after %d iterations.  ", nIters );
    if ( !p->pPars->fSilent )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    p->pPars->iFrame = nIters - 1;
    return 1; // unreachable
}